

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

int verify_cert_chain(X509_STORE *store,X509 *cert,stack_st_X509 *chain,int is_server,
                     char *server_name,int *ossl_x509_err)

{
  int iVar1;
  X509_STORE_CTX *ctx;
  X509_VERIFY_PARAM *param;
  size_t sVar2;
  int iVar3;
  
  *ossl_x509_err = 0;
  ctx = X509_STORE_CTX_new();
  if (ctx == (X509_STORE_CTX *)0x0) {
    return 0x201;
  }
  iVar1 = X509_STORE_CTX_init(ctx,(X509_STORE *)store,(X509 *)cert,(stack_st_X509 *)chain);
  iVar3 = 0x203;
  if (iVar1 != 1) goto LAB_0013676d;
  param = X509_STORE_CTX_get0_param(ctx);
  X509_VERIFY_PARAM_set_purpose(param,(is_server == 0) + 1);
  X509_VERIFY_PARAM_set_depth(param,0x62);
  if (server_name != (char *)0x0 && is_server == 0) {
    iVar1 = ptls_server_name_is_ipaddr(server_name);
    if (iVar1 == 0) {
      sVar2 = strlen(server_name);
      X509_VERIFY_PARAM_set1_host(param,server_name,sVar2);
      X509_VERIFY_PARAM_set_hostflags(param,4);
    }
    else {
      X509_VERIFY_PARAM_set1_ip_asc(param,server_name);
    }
  }
  iVar1 = X509_verify_cert(ctx);
  iVar3 = 0;
  if (iVar1 == 1) goto LAB_0013676d;
  iVar1 = X509_STORE_CTX_get_error(ctx);
  *ossl_x509_err = iVar1;
  if (0x10 < iVar1) {
    switch(iVar1) {
    case 0x11:
      iVar3 = 0x201;
      break;
    case 0x14:
    case 0x1b:
    case 0x1c:
switchD_0013672c_caseD_14:
      iVar3 = 0x30;
      break;
    case 0x17:
      iVar3 = 0x2c;
      break;
    default:
      if ((iVar1 == 0x3e) || (iVar1 == 0x4f)) {
        iVar3 = 0x2a;
        break;
      }
    case 0x12:
    case 0x13:
    case 0x15:
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
switchD_0013672c_caseD_12:
      iVar3 = 0x2e;
    }
LAB_0013676d:
    X509_STORE_CTX_free(ctx);
    return iVar3;
  }
  if (iVar1 - 9U < 2) {
    iVar3 = 0x2d;
    goto LAB_0013676d;
  }
  if (iVar1 == 2) goto switchD_0013672c_caseD_14;
  goto switchD_0013672c_caseD_12;
}

Assistant:

static int verify_cert_chain(X509_STORE *store, X509 *cert, STACK_OF(X509) * chain, int is_server, const char *server_name,
                             int *ossl_x509_err)
{
    X509_STORE_CTX *verify_ctx;
    int ret;
    *ossl_x509_err = 0;

    /* verify certificate chain */
    if ((verify_ctx = X509_STORE_CTX_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if (X509_STORE_CTX_init(verify_ctx, store, cert, chain) != 1) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }

    { /* setup verify params */
        X509_VERIFY_PARAM *params = X509_STORE_CTX_get0_param(verify_ctx);
        X509_VERIFY_PARAM_set_purpose(params, is_server ? X509_PURPOSE_SSL_CLIENT : X509_PURPOSE_SSL_SERVER);
        X509_VERIFY_PARAM_set_depth(params, 98); /* use the default of OpenSSL 1.0.2 and above; see `man SSL_CTX_set_verify` */
        /* when _acting_ as client, set the server name if provided*/
        if (!is_server && server_name != NULL) {
            if (ptls_server_name_is_ipaddr(server_name)) {
                X509_VERIFY_PARAM_set1_ip_asc(params, server_name);
            } else {
                X509_VERIFY_PARAM_set1_host(params, server_name, strlen(server_name));
                X509_VERIFY_PARAM_set_hostflags(params, X509_CHECK_FLAG_NO_PARTIAL_WILDCARDS);
            }
        }
    }

    if (X509_verify_cert(verify_ctx) != 1) {
        *ossl_x509_err = X509_STORE_CTX_get_error(verify_ctx);
        switch (*ossl_x509_err) {
        case X509_V_ERR_OUT_OF_MEM:
            ret = PTLS_ERROR_NO_MEMORY;
            break;
        case X509_V_ERR_CERT_REVOKED:
            ret = PTLS_ALERT_CERTIFICATE_REVOKED;
            break;
        case X509_V_ERR_CERT_NOT_YET_VALID:
        case X509_V_ERR_CERT_HAS_EXPIRED:
            ret = PTLS_ALERT_CERTIFICATE_EXPIRED;
            break;
        case X509_V_ERR_UNABLE_TO_GET_ISSUER_CERT:
        case X509_V_ERR_UNABLE_TO_GET_ISSUER_CERT_LOCALLY:
        case X509_V_ERR_CERT_UNTRUSTED:
        case X509_V_ERR_CERT_REJECTED:
            ret = PTLS_ALERT_UNKNOWN_CA;
            break;
        case X509_V_ERR_HOSTNAME_MISMATCH:
        case X509_V_ERR_INVALID_CA:
            ret = PTLS_ALERT_BAD_CERTIFICATE;
            break;
        default:
            ret = PTLS_ALERT_CERTIFICATE_UNKNOWN;
            break;
        }
        goto Exit;
    }

    ret = 0;

Exit:
    if (verify_ctx != NULL)
        X509_STORE_CTX_free(verify_ctx);
    return ret;
}